

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

void __thiscall
wasm::OptimizeInstructions::optimizeAddedConstants(wasm::Binary*)::ZeroRemover::visitBinary(wasm::
Binary__(void *this,Binary *curr)

{
  BinaryOp BVar1;
  PassOptions *pPVar2;
  bool bVar3;
  bool bVar4;
  BinaryOp BVar5;
  Index IVar6;
  Module *pMVar7;
  byte local_50a;
  byte local_4f1;
  byte local_4d1;
  EffectAnalyzer local_4b8;
  byte local_341;
  EffectAnalyzer local_340;
  Const *local_1d0;
  byte local_1b1;
  EffectAnalyzer local_1b0;
  Const *local_40;
  Const *local_38;
  Const *local_30;
  Const *right;
  Const *left;
  Type type;
  Binary *curr_local;
  ZeroRemover *this_local;
  
  type.id = (uintptr_t)curr;
  bVar3 = wasm::Type::isInteger
                    (&(curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.
                      type);
  if (!bVar3) {
    return;
  }
  left = *(Const **)(type.id + 8);
  right = Expression::dynCast<wasm::Const>(*(Expression **)(type.id + 0x18));
  local_30 = Expression::dynCast<wasm::Const>(*(Expression **)(type.id + 0x20));
  BVar1 = *(BinaryOp *)(type.id + 0x10);
  local_38 = left;
  BVar5 = Abstract::getBinary((Type)left,Add);
  if (BVar1 == BVar5) {
    if ((right != (Const *)0x0) && (bVar3 = wasm::Literal::isZero(&right->value), bVar3)) {
      Walker<ZeroRemover,_wasm::Visitor<ZeroRemover,_void>_>::replaceCurrent
                ((Walker<ZeroRemover,_wasm::Visitor<ZeroRemover,_void>_> *)this,
                 *(Expression **)(type.id + 0x20));
      return;
    }
    if (local_30 == (Const *)0x0) {
      return;
    }
    bVar3 = wasm::Literal::isZero(&local_30->value);
    if (!bVar3) {
      return;
    }
    Walker<ZeroRemover,_wasm::Visitor<ZeroRemover,_void>_>::replaceCurrent
              ((Walker<ZeroRemover,_wasm::Visitor<ZeroRemover,_void>_> *)this,
               *(Expression **)(type.id + 0x18));
    return;
  }
  BVar1 = *(BinaryOp *)(type.id + 0x10);
  local_40 = left;
  BVar5 = Abstract::getBinary((Type)left,Shl);
  if (BVar1 != BVar5) {
    BVar1 = *(BinaryOp *)(type.id + 0x10);
    local_1d0 = left;
    BVar5 = Abstract::getBinary((Type)left,Mul);
    if (BVar1 != BVar5) {
      return;
    }
    local_341 = 0;
    local_4f1 = 0;
    if (right != (Const *)0x0) {
      bVar3 = wasm::Literal::isZero(&right->value);
      local_4f1 = 0;
      if (bVar3) {
        pPVar2 = *(PassOptions **)((long)this + 0xd8);
        pMVar7 = Walker<ZeroRemover,_wasm::Visitor<ZeroRemover,_void>_>::getModule
                           ((Walker<ZeroRemover,_wasm::Visitor<ZeroRemover,_void>_> *)this);
        EffectAnalyzer::EffectAnalyzer(&local_340,pPVar2,pMVar7,*(Expression **)(type.id + 0x20));
        local_341 = 1;
        bVar3 = EffectAnalyzer::hasSideEffects(&local_340);
        local_4f1 = bVar3 ^ 0xff;
      }
    }
    if ((local_341 & 1) != 0) {
      EffectAnalyzer::~EffectAnalyzer(&local_340);
    }
    if ((local_4f1 & 1) == 0) {
      bVar3 = false;
      local_50a = 0;
      if (local_30 != (Const *)0x0) {
        bVar4 = wasm::Literal::isZero(&local_30->value);
        local_50a = 0;
        if (bVar4) {
          pPVar2 = *(PassOptions **)((long)this + 0xd8);
          pMVar7 = Walker<ZeroRemover,_wasm::Visitor<ZeroRemover,_void>_>::getModule
                             ((Walker<ZeroRemover,_wasm::Visitor<ZeroRemover,_void>_> *)this);
          EffectAnalyzer::EffectAnalyzer(&local_4b8,pPVar2,pMVar7,*(Expression **)(type.id + 0x18));
          bVar3 = true;
          bVar4 = EffectAnalyzer::hasSideEffects(&local_4b8);
          local_50a = bVar4 ^ 0xff;
        }
      }
      if (bVar3) {
        EffectAnalyzer::~EffectAnalyzer(&local_4b8);
      }
      if ((local_50a & 1) == 0) {
        return;
      }
      Walker<ZeroRemover,_wasm::Visitor<ZeroRemover,_void>_>::replaceCurrent
                ((Walker<ZeroRemover,_wasm::Visitor<ZeroRemover,_void>_> *)this,
                 (Expression *)local_30);
      return;
    }
    Walker<ZeroRemover,_wasm::Visitor<ZeroRemover,_void>_>::replaceCurrent
              ((Walker<ZeroRemover,_wasm::Visitor<ZeroRemover,_void>_> *)this,(Expression *)right);
    return;
  }
  local_1b1 = 0;
  if ((right == (Const *)0x0) || (bVar3 = wasm::Literal::isZero(&right->value), !bVar3)) {
    local_4d1 = 0;
    if (local_30 == (Const *)0x0) goto LAB_018f9274;
    IVar6 = Bits::getEffectiveShifts((Expression *)local_30);
    local_4d1 = 0;
    if (IVar6 != 0) goto LAB_018f9274;
  }
  pPVar2 = *(PassOptions **)((long)this + 0xd8);
  pMVar7 = Walker<ZeroRemover,_wasm::Visitor<ZeroRemover,_void>_>::getModule
                     ((Walker<ZeroRemover,_wasm::Visitor<ZeroRemover,_void>_> *)this);
  EffectAnalyzer::EffectAnalyzer(&local_1b0,pPVar2,pMVar7,*(Expression **)(type.id + 0x20));
  local_1b1 = 1;
  bVar3 = EffectAnalyzer::hasSideEffects(&local_1b0);
  local_4d1 = bVar3 ^ 0xff;
LAB_018f9274:
  if ((local_1b1 & 1) != 0) {
    EffectAnalyzer::~EffectAnalyzer(&local_1b0);
  }
  if ((local_4d1 & 1) != 0) {
    Walker<ZeroRemover,_wasm::Visitor<ZeroRemover,_void>_>::replaceCurrent
              ((Walker<ZeroRemover,_wasm::Visitor<ZeroRemover,_void>_> *)this,
               *(Expression **)(type.id + 0x18));
  }
  return;
}

Assistant:

void visitBinary(Binary* curr) {
        if (!curr->type.isInteger()) {
          return;
        }
        auto type = curr->type;
        auto* left = curr->left->dynCast<Const>();
        auto* right = curr->right->dynCast<Const>();
        // Canonicalization prefers an add instead of a subtract wherever
        // possible. That prevents a subtracted constant on the right,
        // as it would be added. And for a zero on the left, it can't be
        // removed (it is how we negate ints).
        if (curr->op == Abstract::getBinary(type, Abstract::Add)) {
          if (left && left->value.isZero()) {
            replaceCurrent(curr->right);
            return;
          }
          if (right && right->value.isZero()) {
            replaceCurrent(curr->left);
            return;
          }
        } else if (curr->op == Abstract::getBinary(type, Abstract::Shl)) {
          // shifting a 0 is a 0, or anything by 0 has no effect, all unless the
          // shift has side effects
          if (((left && left->value.isZero()) ||
               (right && Bits::getEffectiveShifts(right) == 0)) &&
              !EffectAnalyzer(passOptions, *getModule(), curr->right)
                 .hasSideEffects()) {
            replaceCurrent(curr->left);
            return;
          }
        } else if (curr->op == Abstract::getBinary(type, Abstract::Mul)) {
          // multiplying by zero is a zero, unless the other side has side
          // effects
          if (left && left->value.isZero() &&
              !EffectAnalyzer(passOptions, *getModule(), curr->right)
                 .hasSideEffects()) {
            replaceCurrent(left);
            return;
          }
          if (right && right->value.isZero() &&
              !EffectAnalyzer(passOptions, *getModule(), curr->left)
                 .hasSideEffects()) {
            replaceCurrent(right);
            return;
          }
        }
      }